

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

void push_layout(mu_Context *ctx,mu_Rect body,mu_Vec2 scroll)

{
  mu_Layout *pmVar1;
  mu_Rect *pmVar2;
  int *piVar3;
  int iVar4;
  mu_Style *pmVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  mu_Vec2 mVar9;
  mu_Vec2 *pmVar10;
  int iVar11;
  ulong uVar12;
  mu_Vec2 mVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  
  lVar6 = (long)(ctx->layout_stack).idx;
  if (lVar6 < 0x10) {
    uVar12 = (ulong)(uint)(body.x - scroll.x) |
             body._0_8_ - ((ulong)scroll & 0xffffffff00000000) & 0xffffffff00000000;
    pmVar1 = (ctx->layout_stack).items + lVar6;
    (pmVar1->body).x = (int)uVar12;
    (pmVar1->body).y = (int)(uVar12 >> 0x20);
    pmVar1 = (ctx->layout_stack).items + lVar6;
    (pmVar1->body).w = (int)body._8_8_;
    (pmVar1->body).h = (int)((ulong)body._8_8_ >> 0x20);
    pmVar2 = &(ctx->layout_stack).items[lVar6].next;
    pmVar2->x = 0;
    pmVar2->y = 0;
    pmVar2->w = 0;
    pmVar2->h = 0;
    pmVar10 = &(ctx->layout_stack).items[lVar6].position;
    pmVar10->x = 0;
    pmVar10->y = 0;
    pmVar10[1].x = 0;
    pmVar10[1].y = 0;
    pmVar1 = (ctx->layout_stack).items + lVar6;
    (pmVar1->max).x = -0x1000000;
    (pmVar1->max).y = -0x1000000;
    piVar3 = (ctx->layout_stack).items[lVar6].widths;
    piVar3[0] = 0;
    piVar3[1] = 0;
    piVar3[2] = 0;
    piVar3[3] = 0;
    piVar3 = (ctx->layout_stack).items[lVar6].widths;
    piVar3[4] = 0;
    piVar3[5] = 0;
    piVar3[6] = 0;
    piVar3[7] = 0;
    piVar3 = (ctx->layout_stack).items[lVar6].widths;
    piVar3[8] = 0;
    piVar3[9] = 0;
    piVar3[10] = 0;
    piVar3[0xb] = 0;
    piVar3 = (ctx->layout_stack).items[lVar6].widths;
    piVar3[0xc] = 0;
    piVar3[0xd] = 0;
    piVar3[0xe] = 0;
    piVar3[0xf] = 0;
    pmVar1 = (ctx->layout_stack).items + lVar6;
    pmVar1->items = 0;
    pmVar1->item_index = 0;
    *(undefined8 *)(&pmVar1->items + 2) = 0;
    (ctx->layout_stack).items[lVar6].indent = 0;
    iVar4 = (ctx->layout_stack).idx;
    (ctx->layout_stack).idx = iVar4 + 1;
    (ctx->layout_stack).items[iVar4].widths[0] = 0;
    pmVar1 = (ctx->layout_stack).items + iVar4;
    pmVar1->items = 1;
    pmVar1->item_index = 0;
    mVar9.y = (ctx->layout_stack).items[iVar4].next_row;
    mVar9.x = (ctx->layout_stack).items[iVar4].indent;
    (ctx->layout_stack).items[iVar4].position = mVar9;
    (ctx->layout_stack).items[iVar4].size.y = 0;
    return;
  }
  push_layout_cold_1();
  iVar4 = (ctx->layout_stack).idx;
  pmVar5 = ctx->style;
  iVar15 = (ctx->layout_stack).items[(long)iVar4 + -1].next_type;
  if (iVar15 == 0) {
    iVar15 = (ctx->layout_stack).items[(long)iVar4 + -1].items;
    iVar17 = (ctx->layout_stack).items[(long)iVar4 + -1].item_index;
    if (iVar17 == iVar15) {
      iVar7 = (ctx->layout_stack).items[(long)iVar4 + -1].next_row;
      iVar16 = (ctx->layout_stack).items[(long)iVar4 + -1].indent;
      mVar13.y = iVar7;
      mVar13.x = iVar16;
      (ctx->layout_stack).items[(long)iVar4 + -1].position = mVar13;
      (ctx->layout_stack).items[(long)iVar4 + -1].item_index = 0;
      iVar17 = 0;
    }
    else {
      iVar16 = (ctx->layout_stack).items[(long)iVar4 + -1].position.x;
      iVar7 = (ctx->layout_stack).items[(long)iVar4 + -1].position.y;
    }
    pmVar10 = (mu_Vec2 *)
              ((long)(ctx->layout_stack).items + (long)iVar17 * 4 + (long)iVar4 * 0x8c + -0x54);
    if (iVar15 < 1) {
      pmVar10 = &(ctx->layout_stack).items[(long)iVar4 + -1].size;
    }
    iVar8 = pmVar10->x;
    iVar11 = (ctx->layout_stack).items[(long)iVar4 + -1].size.y;
    if (iVar8 == 0) {
      iVar8 = pmVar5->padding * 2 + (pmVar5->size).x;
    }
    if (iVar11 == 0) {
      iVar11 = pmVar5->padding * 2 + (pmVar5->size).y;
    }
    if (iVar8 < 0) {
      iVar8 = (iVar8 - iVar16) + *(int *)((long)&ctx->id_stack + (long)iVar4 * 0x8c + 4) + 1;
    }
    if (iVar11 < 0) {
      iVar11 = (iVar11 - iVar7) + (ctx->layout_stack).items[(long)iVar4 + -1].body.h + 1;
    }
    (ctx->layout_stack).items[(long)iVar4 + -1].item_index = iVar17 + 1;
    iVar15 = iVar16;
  }
  else {
    (ctx->layout_stack).items[(long)iVar4 + -1].next_type = 0;
    iVar16 = (ctx->layout_stack).items[(long)iVar4 + -1].next.x;
    iVar7 = (ctx->layout_stack).items[(long)iVar4 + -1].next.y;
    iVar8 = (ctx->layout_stack).items[(long)iVar4 + -1].next.w;
    iVar11 = (ctx->layout_stack).items[(long)iVar4 + -1].next.h;
    if (iVar15 == 2) goto LAB_0013d56c;
    iVar15 = (ctx->layout_stack).items[(long)iVar4 + -1].position.x;
  }
  iVar17 = pmVar5->spacing;
  (ctx->layout_stack).items[(long)iVar4 + -1].position.x = iVar15 + iVar17 + iVar8;
  iVar15 = (ctx->layout_stack).items[(long)iVar4 + -1].next_row;
  iVar17 = iVar7 + iVar11 + iVar17;
  if (iVar17 < iVar15) {
    iVar17 = iVar15;
  }
  (ctx->layout_stack).items[(long)iVar4 + -1].next_row = iVar17;
  iVar16 = iVar16 + *(int *)((long)&ctx->id_stack + (long)iVar4 * 0x8c + -4);
  iVar7 = iVar7 + *(int *)((long)&ctx->id_stack + (long)iVar4 * 0x8c);
  iVar15 = (ctx->layout_stack).items[(long)iVar4 + -1].max.x;
  iVar17 = (ctx->layout_stack).items[(long)iVar4 + -1].max.y;
  iVar14 = iVar16 + iVar8;
  if (iVar16 + iVar8 < iVar15) {
    iVar14 = iVar15;
  }
  (ctx->layout_stack).items[(long)iVar4 + -1].max.x = iVar14;
  iVar15 = iVar7 + iVar11;
  if (iVar7 + iVar11 < iVar17) {
    iVar15 = iVar17;
  }
  (ctx->layout_stack).items[(long)iVar4 + -1].max.y = iVar15;
LAB_0013d56c:
  (ctx->last_rect).x = iVar16;
  (ctx->last_rect).y = iVar7;
  (ctx->last_rect).w = iVar8;
  (ctx->last_rect).h = iVar11;
  return;
}

Assistant:

static void push_layout(mu_Context *ctx, mu_Rect body, mu_Vec2 scroll) {
  mu_Layout layout;
  int width = 0;
  memset(&layout, 0, sizeof(layout));
  layout.body = mu_rect(body.x - scroll.x, body.y - scroll.y, body.w, body.h);
  layout.max = mu_vec2(-0x1000000, -0x1000000);
  push(ctx->layout_stack, layout);
  mu_layout_row(ctx, 1, &width, 0);
}